

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_treeops.c
# Opt level: O2

_Bool nbt_map(nbt_node *tree,nbt_visitor_t v,void *aux)

{
  list_head *plVar1;
  _Bool _Var2;
  nbt_type nVar3;
  bool bVar4;
  
  if (v == (nbt_visitor_t)0x0) {
    __assert_fail("v",
                  "/workspace/llm4binary/github/license_c_cmakelists/chmod222[P]cNBT/nbt_treeops.c",
                  0xc9,"_Bool nbt_map(nbt_node *, nbt_visitor_t, void *)");
  }
  _Var2 = true;
  if (tree != (nbt_node *)0x0) {
    _Var2 = (*v)(tree,aux);
    if (_Var2) {
      nVar3 = tree->type;
      if (nVar3 != TAG_COMPOUND) {
LAB_0010297a:
        if (nVar3 != TAG_LIST) {
          return true;
        }
        plVar1 = &((tree->payload).tag_list)->entry;
        do {
          plVar1 = plVar1->flink;
          bVar4 = plVar1 == &((tree->payload).tag_list)->entry;
          if (bVar4) {
            return bVar4;
          }
          _Var2 = nbt_map((nbt_node *)plVar1[-1].flink,v,aux);
        } while (_Var2);
        return bVar4;
      }
      plVar1 = &((tree->payload).tag_list)->entry;
      do {
        plVar1 = plVar1->flink;
        if (plVar1 == &((tree->payload).tag_list)->entry) {
          nVar3 = tree->type;
          goto LAB_0010297a;
        }
        _Var2 = nbt_map((nbt_node *)plVar1[-1].flink,v,aux);
      } while (_Var2);
    }
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

bool nbt_map(nbt_node* tree, nbt_visitor_t v, void* aux)
{
    assert(v);

    if(tree == NULL)  return true;
    if(!v(tree, aux)) return false;

    /* And if the item is a list or compound, recurse through each of their elements. */
    if(tree->type == TAG_COMPOUND)
    {
        struct list_head* pos;

        list_for_each(pos, &tree->payload.tag_compound->entry)
            if(!nbt_map(list_entry(pos, struct nbt_list, entry)->data, v, aux))
                return false;
    }
    
    if(tree->type == TAG_LIST)
    {
        struct list_head* pos;

        list_for_each(pos, &tree->payload.tag_list->entry)
            if(!nbt_map(list_entry(pos, struct nbt_list, entry)->data, v, aux))
                return false;
    }

    return true;
}